

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O3

uintb __thiscall MemoryBank::getValue(MemoryBank *this,uintb offset,int4 size)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  
  iVar3 = this->wordsize;
  uVar7 = (uint)offset & iVar3 - 1U;
  iVar2 = (*this->_vptr_MemoryBank[1])(this,(long)-iVar3 & offset);
  uVar6 = CONCAT44(extraout_var,iVar2);
  cVar1 = (char)(iVar3 - uVar7);
  if ((int)(iVar3 - uVar7) < size) {
    iVar3 = (*this->_vptr_MemoryBank[1])(this,((long)-iVar3 & offset) + (long)this->wordsize);
    if ((this->space->flags & 1) == 0) {
      uVar6 = uVar6 >> ((byte)(uVar7 << 3) & 0x3f);
      uVar4 = CONCAT44(extraout_var_00,iVar3) << (cVar1 * '\b' & 0x3fU);
    }
    else {
      cVar1 = (char)size - cVar1;
      uVar6 = uVar6 << (cVar1 * '\b' & 0x3fU);
      uVar4 = CONCAT44(extraout_var_00,iVar3) >> (((char)this->wordsize - cVar1) * '\b' & 0x3fU);
    }
    uVar6 = uVar6 | uVar4;
  }
  else {
    if (this->wordsize == size) {
      return uVar6;
    }
    if ((this->space->flags & 1) == 0) {
      bVar5 = (byte)(uVar7 << 3);
    }
    else {
      bVar5 = (cVar1 - (char)size) * '\b';
    }
    uVar6 = uVar6 >> (bVar5 & 0x3f);
  }
  iVar3 = 8;
  if (size < 8) {
    iVar3 = size;
  }
  return uVar6 & uintbmasks[iVar3];
}

Assistant:

uintb MemoryBank::getValue(uintb offset,int4 size) const

{
  uintb res;
 
  uintb alignmask = (uintb) (wordsize-1);
  uintb ind = offset & (~alignmask);
  int4 skip = offset & alignmask;
  int4 size1 = wordsize-skip;
  int4 size2;
  int4 gap;
  uintb val1,val2;
  if (size > size1) {		// We have spill over
    size2 = size - size1;
    val1 = find(ind);
    val2 = find(ind+wordsize);
    gap = wordsize - size2;
  }
  else {
    val1 = find(ind);
    val2 = 0;
    if (size == wordsize)
      return val1;
    gap = size1-size;
    size1 = size;
    size2 = 0;
  }

  if (space->isBigEndian()) {
    if (size2 == 0)
      res = val1>>(8*gap);
    else
      res = (val1<<(8*size2)) | (val2 >> (8*gap));
  }
  else {
    if (size2 == 0)
      res = val1 >> (skip*8);
    else
      res = (val1>>(skip*8)) | (val2<<(size1*8) );
  }
  res &= (uintb)calc_mask(size);
  return res;
}